

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  ostream *poVar1;
  Colour colour;
  Colour local_19;
  
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    Colour::Colour(&local_19,BrightRed);
    poVar1 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nNo assertions in section, \'",0x1c)
    ;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    Colour::~Colour(&local_19);
  }
  this->m_headerPrinted = false;
  Ptr<Catch::ThreadedSectionInfo>::operator=
            (&(this->super_StreamingReporterBase).currentSectionInfo,
             ((this->super_StreamingReporterBase).currentSectionInfo.m_p)->parent);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                stream << "\nNo assertions in section, '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            m_headerPrinted = false;
            StreamingReporterBase::sectionEnded( _sectionStats );
        }